

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall
QtMWidgets::AbstractScrollArea::mousePressEvent(AbstractScrollArea *this,QMouseEvent *e)

{
  int iVar1;
  AbstractScrollAreaPrivate *this_00;
  QPoint QVar2;
  double dVar3;
  double in_XMM1_Qa;
  
  iVar1 = *(int *)(e + 0x40);
  if (iVar1 == 1) {
    dVar3 = (double)QEventPoint::position();
    QVar2.xp = (int)((double)((ulong)dVar3 & 0x8000000000000000 | 0x3fe0000000000000) + dVar3);
    QVar2.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                    in_XMM1_Qa);
    ((this->d).d)->mousePos = QVar2;
    this_00 = (this->d).d;
    this_00->leftMouseButtonPressed = true;
    AbstractScrollAreaPrivate::stopScrollIndicatorsAnimation(this_00);
  }
  e[0xc] = (QMouseEvent)(iVar1 == 1);
  return;
}

Assistant:

void
AbstractScrollArea::mousePressEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		d->mousePos = e->pos();
		d->leftMouseButtonPressed = true;
		d->stopScrollIndicatorsAnimation();

		e->accept();
	}
	else
		e->ignore();
}